

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O3

Panel ui::panel::About(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Panel PVar1;
  undefined1 local_29;
  AboutImpl *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (AboutImpl *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ui::AboutImpl,std::allocator<ui::AboutImpl>>
            (a_Stack_20,&local_28,(allocator<ui::AboutImpl> *)&local_29);
  (in_RDI->super_ComponentBase)._vptr_ComponentBase = (_func_int **)local_28;
  (in_RDI->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)a_Stack_20[0]._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Panel)PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Panel About() {
  return Make<AboutImpl>();
}